

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud.cc
# Opt level: O1

void __thiscall draco::PointCloud::DeduplicatePointIds(PointCloud *this)

{
  _Hash_node_base *p_Var1;
  size_type sVar2;
  uint uVar3;
  ulong uVar4;
  __node_base_ptr *pp_Var5;
  __hash_code __c;
  __node_ptr p_Var6;
  _Hash_node_base *p_Var7;
  _Hash_node_base *__c_00;
  __node_base_ptr *pp_Var8;
  __node_base _Var9;
  size_type __n;
  ulong uVar10;
  pointer __ptr_1;
  undefined1 auVar11 [16];
  __buckets_alloc_type __alloc_1;
  unordered_map<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_atteneder[P]draco_src_draco_point_cloud_point_cloud_cc:203:21),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_atteneder[P]draco_src_draco_point_cloud_point_cloud_cc:212:24),_std::allocator<std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>_>
  unique_point_map;
  vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
  unique_points;
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>
  index_map;
  IndexType<unsigned_int,_draco::PointIndex_tag_type_> local_b8;
  new_allocator<std::__detail::_Hash_node_base_*> local_b1;
  _Hashtable<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>,_std::allocator<std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>,_std::__detail::_Select1st,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_atteneder[P]draco_src_draco_point_cloud_point_cloud_cc:212:24),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_atteneder[P]draco_src_draco_point_cloud_point_cloud_cc:203:21),_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_b0;
  void *local_68;
  iterator iStack_60;
  IndexType<unsigned_int,_draco::PointIndex_tag_type_> *local_58;
  ulong local_50;
  vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
  local_48;
  
  local_b0._M_buckets = &local_b0._M_single_bucket;
  local_b0._M_bucket_count = 1;
  local_b0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_b0._M_element_count = 0;
  local_b0._M_rehash_policy._M_max_load_factor = 1.0;
  local_b0._M_rehash_policy._M_next_resize = 0;
  local_b0._M_single_bucket = (__node_base_ptr)0x0;
  local_b0.
  super__Hashtable_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>,_std::__detail::_Select1st,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_atteneder[P]draco_src_draco_point_cloud_point_cloud_cc:212:24),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_atteneder[P]draco_src_draco_point_cloud_point_cloud_cc:203:21),_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  .
  super__Hash_code_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>,_std::__detail::_Select1st,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_atteneder[P]draco_src_draco_point_cloud_point_cloud_cc:203:21),_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
  .
  super__Hashtable_ebo_helper<1,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_atteneder[P]draco_src_draco_point_cloud_point_cloud_cc:203:21),_false>
  ._M_tp.this = (_Hashtable_ebo_helper<1,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_atteneder[P]draco_src_draco_point_cloud_point_cloud_cc:203:21),_false>
                 )(_Hashtable_ebo_helper<1,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_atteneder[P]draco_src_draco_point_cloud_point_cloud_cc:203:21),_false>
                   )this;
  local_b0.
  super__Hashtable_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>,_std::__detail::_Select1st,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_atteneder[P]draco_src_draco_point_cloud_point_cloud_cc:212:24),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_atteneder[P]draco_src_draco_point_cloud_point_cloud_cc:203:21),_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  .
  super__Hashtable_ebo_helper<0,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_atteneder[P]draco_src_draco_point_cloud_point_cloud_cc:212:24),_false>
  ._M_tp.this = (key_equal)(key_equal)this;
  uVar4 = std::__detail::_Prime_rehash_policy::_M_next_bkt((ulong)&local_b0._M_rehash_policy);
  if (local_b0._M_bucket_count < uVar4) {
    if (uVar4 == 1) {
      local_b0._M_single_bucket = (__node_base_ptr)0x0;
      local_b0._M_buckets = &local_b0._M_single_bucket;
      local_b0._M_bucket_count = uVar4;
    }
    else {
      pp_Var5 = __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                          ((new_allocator<std::__detail::_Hash_node_base_*> *)&local_48,uVar4,
                           (void *)0x0);
      memset(pp_Var5,0,uVar4 << 3);
      local_b0._M_buckets = pp_Var5;
      local_b0._M_bucket_count = uVar4;
    }
  }
  std::
  vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
  ::vector(&local_48,(ulong)this->num_points_,(allocator_type *)&local_68);
  local_68 = (void *)0x0;
  iStack_60._M_current = (IndexType<unsigned_int,_draco::PointIndex_tag_type_> *)0x0;
  local_58 = (IndexType<unsigned_int,_draco::PointIndex_tag_type_> *)0x0;
  local_b8.value_ = 0;
  uVar3 = this->num_points_;
  uVar4 = 0;
  if (uVar3 != 0) {
    uVar10 = 0;
    do {
      __c = std::__detail::
            _Hash_code_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>,_std::__detail::_Select1st,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/atteneder[P]draco/src/draco/point_cloud/point_cloud.cc:203:21),_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
            ::_M_hash_code((_Hash_code_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>,_std::__detail::_Select1st,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_atteneder[P]draco_src_draco_point_cloud_point_cloud_cc:203:21),_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
                            *)&local_b0,&local_b8);
      p_Var6 = std::
               _Hashtable<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>,_std::allocator<std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>,_std::__detail::_Select1st,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/atteneder[P]draco/src/draco/point_cloud/point_cloud.cc:212:24),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/atteneder[P]draco/src/draco/point_cloud/point_cloud.cc:203:21),_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::_M_find_node(&local_b0,__c % local_b0._M_bucket_count,&local_b8,__c);
      if (p_Var6 == (__node_ptr)0x0) {
        p_Var7 = (_Hash_node_base *)operator_new(0x18);
        p_Var7->_M_nxt = (_Hash_node_base *)0x0;
        *(int *)&p_Var7[1]._M_nxt = (int)uVar10;
        *(int *)((long)&p_Var7[1]._M_nxt + 4) = (int)uVar4;
        local_50 = uVar4;
        __c_00 = (_Hash_node_base *)
                 std::__detail::
                 _Hash_code_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>,_std::__detail::_Select1st,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/atteneder[P]draco/src/draco/point_cloud/point_cloud.cc:203:21),_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
                 ::_M_hash_code((_Hash_code_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>,_std::__detail::_Select1st,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_atteneder[P]draco_src_draco_point_cloud_point_cloud_cc:203:21),_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
                                 *)&local_b0,
                                (IndexType<unsigned_int,_draco::PointIndex_tag_type_> *)(p_Var7 + 1)
                               );
        sVar2 = local_b0._M_bucket_count;
        uVar4 = (ulong)__c_00 % local_b0._M_bucket_count;
        p_Var6 = std::
                 _Hashtable<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>,_std::allocator<std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>,_std::__detail::_Select1st,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/atteneder[P]draco/src/draco/point_cloud/point_cloud.cc:212:24),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/atteneder[P]draco/src/draco/point_cloud/point_cloud.cc:203:21),_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::_M_find_node(&local_b0,uVar4,(key_type *)(p_Var7 + 1),(__hash_code)__c_00);
        if (p_Var6 == (__node_ptr)0x0) {
          auVar11 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                              ((ulong)&local_b0._M_rehash_policy,sVar2,local_b0._M_element_count);
          __n = auVar11._8_8_;
          if ((auVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            if (__n == 1) {
              local_b0._M_single_bucket = (__node_base_ptr)0x0;
              pp_Var5 = &local_b0._M_single_bucket;
            }
            else {
              pp_Var5 = __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                                  (&local_b1,__n,(void *)0x0);
              memset(pp_Var5,0,__n * 8);
            }
            _Var9._M_nxt = local_b0._M_before_begin._M_nxt;
            local_b0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
            if (_Var9._M_nxt != (_Hash_node_base *)0x0) {
              uVar4 = 0;
              do {
                p_Var1 = (_Var9._M_nxt)->_M_nxt;
                uVar10 = (ulong)_Var9._M_nxt[2]._M_nxt % __n;
                if (pp_Var5[uVar10] == (_Hash_node_base *)0x0) {
                  (_Var9._M_nxt)->_M_nxt = local_b0._M_before_begin._M_nxt;
                  pp_Var5[uVar10] = &local_b0._M_before_begin;
                  local_b0._M_before_begin._M_nxt = _Var9._M_nxt;
                  if ((_Var9._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
                    pp_Var8 = pp_Var5 + uVar4;
                    goto LAB_0014ee4a;
                  }
                }
                else {
                  (_Var9._M_nxt)->_M_nxt = pp_Var5[uVar10]->_M_nxt;
                  pp_Var8 = &pp_Var5[uVar10]->_M_nxt;
                  uVar10 = uVar4;
LAB_0014ee4a:
                  *pp_Var8 = _Var9._M_nxt;
                }
                _Var9._M_nxt = p_Var1;
                uVar4 = uVar10;
              } while (p_Var1 != (_Hash_node_base *)0x0);
            }
            if (&local_b0._M_single_bucket != local_b0._M_buckets) {
              operator_delete(local_b0._M_buckets,local_b0._M_bucket_count << 3);
            }
            uVar4 = (ulong)__c_00 % __n;
            local_b0._M_buckets = pp_Var5;
            local_b0._M_bucket_count = __n;
          }
          p_Var7[2]._M_nxt = __c_00;
          if (local_b0._M_buckets[uVar4] == (_Hash_node_base *)0x0) {
            p_Var7->_M_nxt = local_b0._M_before_begin._M_nxt;
            if (local_b0._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
              local_b0._M_buckets
              [(ulong)local_b0._M_before_begin._M_nxt[2]._M_nxt % local_b0._M_bucket_count] = p_Var7
              ;
            }
            local_b0._M_buckets[uVar4] = &local_b0._M_before_begin;
            local_b0._M_before_begin._M_nxt = p_Var7;
          }
          else {
            p_Var7->_M_nxt = local_b0._M_buckets[uVar4]->_M_nxt;
            local_b0._M_buckets[uVar4]->_M_nxt = p_Var7;
          }
          uVar3 = (uint)local_50;
          local_b0._M_element_count = local_b0._M_element_count + 1;
          p_Var7 = (_Hash_node_base *)0x0;
        }
        else {
          uVar3 = (uint)local_50;
        }
        if (p_Var7 != (_Hash_node_base *)0x0) {
          operator_delete(p_Var7,0x18);
        }
        local_48.
        super__Vector_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[local_b8.value_].value_ = uVar3;
        uVar4 = (ulong)(uVar3 + 1);
        if (iStack_60._M_current == local_58) {
          std::
          vector<draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>>>
          ::_M_realloc_insert<draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>const&>
                    ((vector<draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>>>
                      *)&local_68,iStack_60,&local_b8);
        }
        else {
          (iStack_60._M_current)->value_ = local_b8.value_;
          iStack_60._M_current = iStack_60._M_current + 1;
        }
      }
      else {
        local_48.
        super__Vector_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar10].value_ =
             *(uint *)((long)&(p_Var6->
                              super__Hash_node_value<std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>,_true>
                              ).
                              super__Hash_node_value_base<std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
                              ._M_storage._M_storage + 4);
      }
      local_b8.value_ = local_b8.value_ + 1;
      uVar10 = (ulong)local_b8.value_;
      uVar3 = this->num_points_;
    } while (local_b8.value_ < uVar3);
  }
  if ((uint)uVar4 != uVar3) {
    (*this->_vptr_PointCloud[6])(this,&local_48,&local_68);
    this->num_points_ = (uint)uVar4;
  }
  if (local_68 != (void *)0x0) {
    operator_delete(local_68,(long)local_58 - (long)local_68);
  }
  if (local_48.
      super__Vector_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Hashtable<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>,_std::allocator<std::pair<const_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>,_std::__detail::_Select1st,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/atteneder[P]draco/src/draco/point_cloud/point_cloud.cc:212:24),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/atteneder[P]draco/src/draco/point_cloud/point_cloud.cc:203:21),_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_b0);
  return;
}

Assistant:

void PointCloud::DeduplicatePointIds() {
  // Hashing function for a single vertex.
  auto point_hash = [this](PointIndex p) {
    PointIndex::ValueType hash = 0;
    for (int32_t i = 0; i < this->num_attributes(); ++i) {
      const AttributeValueIndex att_id = attribute(i)->mapped_index(p);
      hash = static_cast<uint32_t>(HashCombine(att_id.value(), hash));
    }
    return hash;
  };
  // Comparison function between two vertices.
  auto point_compare = [this](PointIndex p0, PointIndex p1) {
    for (int32_t i = 0; i < this->num_attributes(); ++i) {
      const AttributeValueIndex att_id0 = attribute(i)->mapped_index(p0);
      const AttributeValueIndex att_id1 = attribute(i)->mapped_index(p1);
      if (att_id0 != att_id1) {
        return false;
      }
    }
    return true;
  };

  std::unordered_map<PointIndex, PointIndex, decltype(point_hash),
                     decltype(point_compare)>
      unique_point_map(num_points_, point_hash, point_compare);
  int32_t num_unique_points = 0;
  IndexTypeVector<PointIndex, PointIndex> index_map(num_points_);
  std::vector<PointIndex> unique_points;
  // Go through all vertices and find their duplicates.
  for (PointIndex i(0); i < num_points_; ++i) {
    const auto it = unique_point_map.find(i);
    if (it != unique_point_map.end()) {
      index_map[i] = it->second;
    } else {
      unique_point_map.insert(std::make_pair(i, PointIndex(num_unique_points)));
      index_map[i] = num_unique_points++;
      unique_points.push_back(i);
    }
  }
  if (num_unique_points == num_points_) {
    return;  // All vertices are already unique.
  }

  ApplyPointIdDeduplication(index_map, unique_points);
  set_num_points(num_unique_points);
}